

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsUtils.cpp
# Opt level: O0

bool predictFromScatterData
               (HighsScatterData *scatter_data,double value0,double *predicted_value1,
               bool log_regression)

{
  double dVar1;
  byte in_DL;
  double *in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar2;
  undefined1 local_1;
  
  if ((*(byte *)(in_RDI + 0x40) & 1) == 0) {
    local_1 = false;
  }
  else if ((in_DL & 1) == 0) {
    *in_RSI = *(double *)(in_RDI + 0x50) * in_XMM0_Qa + *(double *)(in_RDI + 0x48);
    local_1 = true;
  }
  else {
    dVar1 = *(double *)(in_RDI + 0x60);
    dVar2 = pow(in_XMM0_Qa,*(double *)(in_RDI + 0x68));
    *in_RSI = dVar1 * dVar2;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool predictFromScatterData(const HighsScatterData& scatter_data,
                            const double value0, double& predicted_value1,
                            const bool log_regression) {
  if (!scatter_data.have_regression_coeff_) return false;
  if (log_regression) {
    predicted_value1 =
        scatter_data.log_coeff0_ * pow(value0, scatter_data.log_coeff1_);
    return true;
  } else {
    predicted_value1 =
        scatter_data.linear_coeff0_ + scatter_data.linear_coeff1_ * value0;
    return true;
  }
}